

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<int,_const_char_*>
burst::detail::
by_all_impl<0ul,1ul,std::reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>>const,std::tuple<int&&,char_const(&)[4]>>
          (_Tuple_impl<1UL,_const_char_*> param_1,
          reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>> *param_2,
          tuple<int_&&,_const_char_(&)[4]> *param_3)

{
  tuple<int_&&,_const_char_(&)[4]> *this;
  int *__args;
  char (*__args_00) [4];
  undefined8 extraout_RDX;
  tuple<int,_const_char_*> tVar1;
  type local_38;
  type_conflict local_2c;
  tuple<int_&&,_const_char_(&)[4]> *local_28;
  tuple<int_&&,_const_char_(&)[4]> *t_local;
  reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>_> *f_local;
  _Head_base<1UL,_const_char_*,_false> local_10;
  
  local_28 = param_3;
  t_local = (tuple<int_&&,_const_char_(&)[4]> *)param_2;
  local_10 = param_1.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  __args = std::get<0ul,int&&,char_const(&)[4]>(param_3);
  local_2c = std::reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>>::
             operator()(param_2,__args);
  this = t_local;
  __args_00 = std::get<1ul,int&&,char_const(&)[4]>(local_28);
  local_38 = std::reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>>::
             operator()((reference_wrapper<utility::lvalue_call_counter_t<utility::take_first_t>> *)
                        this,__args_00);
  std::tuple<int,_const_char_*>::tuple<int,_const_char_*,_true>
            ((tuple<int,_const_char_*> *)
             param_1.super__Head_base<1UL,_const_char_*,_false>._M_head_impl,&local_2c,&local_38);
  tVar1.super__Tuple_impl<0UL,_int,_const_char_*>._8_8_ = extraout_RDX;
  tVar1.super__Tuple_impl<0UL,_int,_const_char_*>.super__Tuple_impl<1UL,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  return (tuple<int,_const_char_*>)tVar1.super__Tuple_impl<0UL,_int,_const_char_*>;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }